

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O2

char * Curl_inet_ntop(int af,void *src,char *buf,size_t size)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong local_a8 [8];
  char tmp [46];
  undefined1 auStack_3a [10];
  
  if (af == 10) {
    local_a8[6] = 0;
    local_a8[7] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[0] = 0;
    local_a8[1] = 0;
    bVar1 = 0;
    for (uVar12 = 0; uVar12 != 0x10; uVar12 = uVar12 + 1) {
      local_a8[uVar12 >> 1 & 0x7fffffff] =
           local_a8[uVar12 >> 1 & 0x7fffffff] |
           (ulong)((uint)*(byte *)((long)src + uVar12) << (~bVar1 & 8));
      bVar1 = bVar1 + 8;
    }
    lVar9 = -1;
    lVar8 = 0;
    lVar10 = lVar9;
    lVar13 = lVar9;
    lVar16 = 0;
    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
      lVar4 = lVar10;
      lVar15 = lVar16;
      if (local_a8[lVar11] == 0) {
        lVar8 = lVar8 + 1;
        lVar14 = lVar13;
        if (lVar13 == -1) {
          lVar8 = 1;
          lVar14 = lVar11;
        }
      }
      else {
        lVar14 = lVar9;
        if ((lVar13 != -1) && (lVar4 = lVar13, lVar15 = lVar8, lVar8 <= lVar16 && lVar10 != -1)) {
          lVar4 = lVar10;
          lVar15 = lVar16;
        }
      }
      lVar10 = lVar4;
      lVar13 = lVar14;
      lVar16 = lVar15;
    }
    if ((lVar13 != -1) && (lVar16 < lVar8 || lVar10 == -1)) {
      lVar10 = lVar13;
      lVar16 = lVar8;
    }
    lVar9 = -1;
    if (1 < lVar16) {
      lVar9 = lVar10;
    }
    if (lVar10 == -1) {
      lVar9 = lVar10;
    }
    pcVar3 = tmp;
    for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
      if (((lVar9 == -1) || (lVar10 < lVar9)) || (lVar9 + lVar16 <= lVar10)) {
        if (lVar10 != 0) {
          *pcVar3 = ':';
          pcVar3 = pcVar3 + 1;
          if ((lVar10 == 6 && lVar9 == 0) &&
             ((lVar16 == 6 || ((lVar16 == 5 && (local_a8[5] == 0xffff)))))) {
            pcVar6 = inet_ntop4((uchar *)((long)src + 0xc),pcVar3,
                                (size_t)(auStack_3a + -(long)pcVar3));
            if (pcVar6 == (char *)0x0) goto LAB_00394b5a;
            sVar7 = strlen(pcVar3);
            pcVar3 = pcVar3 + sVar7;
            break;
          }
        }
        iVar2 = curl_msnprintf(pcVar3,5,"%lx",local_a8[lVar10]);
        pcVar3 = pcVar3 + iVar2;
      }
      else if (lVar9 == lVar10) {
        *pcVar3 = ':';
        pcVar3 = pcVar3 + 1;
      }
    }
    if ((lVar9 != -1) && (lVar9 + lVar16 == 8)) {
      *pcVar3 = ':';
      pcVar3 = pcVar3 + 1;
    }
    *pcVar3 = '\0';
    if (pcVar3 + (1 - (long)tmp) <= size) {
      strcpy(buf,tmp);
      return buf;
    }
LAB_00394b5a:
    piVar5 = __errno_location();
    *piVar5 = 0x1c;
  }
  else {
    if (af == 2) {
      pcVar3 = inet_ntop4((uchar *)src,buf,size);
      return pcVar3;
    }
    piVar5 = __errno_location();
    *piVar5 = 0x61;
  }
  return (char *)0x0;
}

Assistant:

char *Curl_inet_ntop(int af, const void *src, char *buf, size_t size)
{
  switch(af) {
  case AF_INET:
    return inet_ntop4((const unsigned char *)src, buf, size);
#ifdef ENABLE_IPV6
  case AF_INET6:
    return inet_ntop6((const unsigned char *)src, buf, size);
#endif
  default:
    errno = EAFNOSUPPORT;
    return NULL;
  }
}